

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

char * mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetTypeName(void)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_60 [32];
  string local_40 [32];
  string local_20 [32];
  
  if (AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>::GetTypeName()::name_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      pcVar2 = &stack0xffffffffffffff7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 (allocator<char> *)in_stack_ffffffffffffff70);
      QuadAndLinTerms::GetTypeName();
      std::operator+(in_stack_ffffffffffffff48,pcVar2);
      std::operator+(in_stack_ffffffffffffff48,pcVar2);
      AlgConRhs<0>::GetTypeName_abi_cxx11_();
      std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::operator+(in_stack_ffffffffffffff48,pcVar2);
      std::__cxx11::string::~string(local_20);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
      __cxa_atexit(std::__cxx11::string::~string,
                   &AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>::GetTypeName()::
                    name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>::GetTypeName()
                           ::name_abi_cxx11_);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

static const char* GetTypeName() {
    static std::string name {
      std::string("AlgebraicConstraint< ") +
      Body::GetTypeName() + ", " +
      RhsOrRange::GetTypeName() + " >" };
    return name.c_str();
  }